

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenEnum
          (KotlinGenerator *this,EnumDef *enum_def,CodeWriter *writer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((enum_def->super_Definition).generated == false) {
    GenerateComment(this,&(enum_def->super_Definition).doc_comment,writer,
                    (CommentConfig *)(anonymous_namespace)::comment_config);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"@Suppress(\"unused\")",(allocator<char> *)&local_c0);
    CodeWriter::operator+=(writer,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_80,&this->namer_,enum_def);
    std::operator+(&local_c0,"class ",&local_80);
    std::operator+(&local_60,&local_c0," private constructor() {");
    CodeWriter::operator+=(writer,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
    local_80._M_dataplus._M_p = (pointer)enum_def;
    local_80._M_string_length = (size_type)writer;
    local_80.field_2._M_allocated_capacity = (size_type)this;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenEnum(flatbuffers::EnumDef&,flatbuffers::CodeWriter&)const::_lambda()_1_,void>
              ((function<void()> *)&local_c0,(anon_class_24_3_9f199379 *)&local_80);
    GenerateCompanionObject(this,writer,(function<void_()> *)&local_c0);
    std::_Function_base::~_Function_base((_Function_base *)&local_c0);
    if (writer->cur_ident_lvl_ != 0) {
      writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"}",(allocator<char> *)&local_c0);
    CodeWriter::operator+=(writer,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, CodeWriter &writer) const {
    if (enum_def.generated) return;

    GenerateComment(enum_def.doc_comment, writer, &comment_config);

    writer += "@Suppress(\"unused\")";
    writer += "class " + namer_.Type(enum_def) + " private constructor() {";
    writer.IncrementIdentLevel();

    GenerateCompanionObject(writer, [&]() {
      // Write all properties
      auto vals = enum_def.Vals();
      for (auto it = vals.begin(); it != vals.end(); ++it) {
        auto &ev = **it;
        auto field_type = GenTypeBasic(enum_def.underlying_type.base_type);
        auto val = enum_def.ToString(ev);
        auto suffix = LiteralSuffix(enum_def.underlying_type.base_type);
        writer.SetValue("name", namer_.Variant(ev.name));
        writer.SetValue("type", field_type);
        writer.SetValue("val", val + suffix);
        GenerateComment(ev.doc_comment, writer, &comment_config);
        writer += "const val {{name}}: {{type}} = {{val}}";
      }

      // Generate a generate string table for enum values.
      // Problem is, if values are very sparse that could generate really
      // big tables. Ideally in that case we generate a map lookup
      // instead, but for the moment we simply don't output a table at all.
      auto range = enum_def.Distance();
      // Average distance between values above which we consider a table
      // "too sparse". Change at will.
      static const uint64_t kMaxSparseness = 5;
      bool generate_names =
          range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness &&
          parser_.opts.mini_reflect == IDLOptions::kTypesAndNames;
      if (generate_names) {
        GeneratePropertyOneLine(writer, "names", "Array<String>", [&]() {
          writer += "arrayOf(\\";
          auto val = enum_def.Vals().front();
          for (auto it = vals.begin(); it != vals.end(); ++it) {
            auto ev = *it;
            for (auto k = enum_def.Distance(val, ev); k > 1; --k)
              writer += "\"\", \\";
            val = ev;
            writer += "\"" + (*it)->name + "\"\\";
            if (it + 1 != vals.end()) { writer += ", \\"; }
          }
          writer += ")";
        });
        GenerateFunOneLine(
            writer, "name", "e: Int", "String",
            [&]() {
              writer += "names[e\\";
              if (enum_def.MinValue()->IsNonZero())
                writer += " - " + enum_def.MinValue()->name + ".toInt()\\";
              writer += "]";
            },
            parser_.opts.gen_jvmstatic);
      }
    });
    writer.DecrementIdentLevel();
    writer += "}";
  }